

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsNetId.cpp
# Opt level: O2

void __thiscall AmsNetId::AmsNetId(AmsNetId *this,uint32_t ipv4Addr)

{
  this->b[4] = '\x01';
  this->b[5] = '\x01';
  this->b[3] = (uint8_t)ipv4Addr;
  this->b[2] = (uint8_t)(ipv4Addr >> 8);
  this->b[1] = (uint8_t)(ipv4Addr >> 0x10);
  this->b[0] = (uint8_t)(ipv4Addr >> 0x18);
  return;
}

Assistant:

AmsNetId::AmsNetId(uint32_t ipv4Addr)
{
    b[5] = 1;
    b[4] = 1;
    b[3] = (uint8_t)(ipv4Addr & 0x000000ff);
    b[2] = (uint8_t)((ipv4Addr & 0x0000ff00) >> 8);
    b[1] = (uint8_t)((ipv4Addr & 0x00ff0000) >> 16);
    b[0] = (uint8_t)((ipv4Addr & 0xff000000) >> 24);
}